

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

int inproc_ep_get_addr(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  undefined1 local_a8 [8];
  nng_sockaddr sa;
  
  local_a8._0_2_ = 1;
  nni_strlcpy(local_a8 + 2,*arg,0x80);
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_a8,v,szp,t);
  return iVar1;
}

Assistant:

static int
inproc_ep_get_addr(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	inproc_ep   *ep = arg;
	nng_sockaddr sa;
	sa.s_inproc.sa_family = NNG_AF_INPROC;
	nni_strlcpy(
	    sa.s_inproc.sa_name, ep->addr, sizeof(sa.s_inproc.sa_name));
	return (nni_copyout_sockaddr(&sa, v, szp, t));
}